

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O1

int Llb_CoreReachability(Llb_Img_t *p)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  int iVar4;
  Gia_ParLlb_t *pGVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  Vec_Int_t *vStop;
  Vec_Int_t *vStart;
  ulong uVar8;
  Aig_Man_t *p_00;
  Vec_Ptr_t *vQuant0;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *local_30;
  Vec_Ptr_t *local_28;
  
  pGVar5 = p->pPars;
  if (pGVar5->fBackward == 0) {
    p_00 = p->pAig;
    pVVar6 = p->vDdMans;
    vStart = p->vVarsCs;
    vStop = p->vVarsNs;
  }
  else {
    pVVar6 = p->vDdMans;
    uVar1 = pVVar6->nSize;
    lVar7 = (long)(int)uVar1;
    if (1 < lVar7) {
      uVar8 = 0;
      do {
        lVar7 = lVar7 + -1;
        ppvVar2 = pVVar6->pArray;
        pvVar3 = ppvVar2[uVar8];
        ppvVar2[uVar8] = ppvVar2[lVar7];
        pVVar6->pArray[lVar7] = pvVar3;
        uVar8 = uVar8 + 1;
      } while (uVar1 >> 1 != uVar8);
    }
    pVVar6 = p->vDdMans;
    vStart = p->vVarsNs;
    vStop = p->vVarsCs;
    p_00 = p->pAig;
    pGVar5 = p->pPars;
  }
  pVVar6 = Llb_ImgSupports(p_00,pVVar6,vStart,vStop,0,pGVar5->fVeryVerbose);
  Llb_ImgSchedule(pVVar6,&local_30,&local_28,p->pPars->fVeryVerbose);
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = pVVar6->pArray[lVar7];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (void **)0x0;
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    free(pVVar6);
  }
  Llb_ImgQuantifyFirst(p->pAig,p->vDdMans,local_30,p->pPars->fVeryVerbose);
  iVar4 = Llb_CoreReachability_int(p,local_30,local_28);
  if (0 < local_30->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = local_30->pArray[lVar7];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_30->nSize);
  }
  if (local_30->pArray != (void **)0x0) {
    free(local_30->pArray);
    local_30->pArray = (void **)0x0;
  }
  if (local_30 != (Vec_Ptr_t *)0x0) {
    free(local_30);
  }
  if (0 < local_28->nSize) {
    lVar7 = 0;
    do {
      pvVar3 = local_28->pArray[lVar7];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
          *(undefined8 *)((long)pvVar3 + 8) = 0;
        }
        free(pvVar3);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < local_28->nSize);
  }
  if (local_28->pArray != (void **)0x0) {
    free(local_28->pArray);
    local_28->pArray = (void **)0x0;
  }
  if (local_28 != (Vec_Ptr_t *)0x0) {
    free(local_28);
  }
  return iVar4;
}

Assistant:

int Llb_CoreReachability( Llb_Img_t * p )
{
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    int RetValue;
    // get supports and quantified variables
    if ( p->pPars->fBackward )
    {
        Vec_PtrReverseOrder( p->vDdMans );
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 0, p->pPars->fVeryVerbose );
    }
    else
        vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsCs, p->vVarsNs, 0, p->pPars->fVeryVerbose );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, p->pPars->fVeryVerbose );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    // remove variables
    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0, p->pPars->fVeryVerbose );
    // perform reachability
    RetValue = Llb_CoreReachability_int( p, vQuant0, vQuant1 );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return RetValue;
}